

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinHypot
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  double __x;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  const_reference pvVar1;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  allocator_type *in_RSI;
  long in_RDI;
  Value VVar2;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_00000210;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_00000218;
  string *in_stack_00000220;
  LocationRange *in_stack_00000228;
  Interpreter *in_stack_00000230;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *this_00;
  allocator<char> *__a;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  double in_stack_ffffffffffffffc0;
  LocationRange *in_stack_ffffffffffffffc8;
  Interpreter *in_stack_ffffffffffffffd0;
  
  __a = (allocator<char> *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),__a);
  local_80 = 2;
  local_7c = 2;
  local_78 = &local_80;
  local_70 = 2;
  this_00 = in_RDX;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x22c715);
  __l._M_array._4_4_ = in_stack_ffffffffffffff6c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff68;
  __l._M_len = (size_type)in_stack_ffffffffffffff70;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)__a,__l,in_RSI);
  validateBuiltinArgs(in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_00000218,
                      in_stack_00000210);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             *)this_00);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x22c767);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](in_RDX,0);
  __x = (pvVar1->v).d;
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](in_RDX,1);
  hypot(__x,(pvVar1->v).d);
  VVar2 = makeNumberCheck(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                          in_stack_ffffffffffffffc0);
  *(ulong *)(in_RDI + 0x40) = CONCAT44(in_stack_ffffffffffffff6c,VVar2.t);
  *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = VVar2.v;
  return (AST *)0x0;
}

Assistant:

const AST *builtinHypot(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "hypot", args, {Value::NUMBER, Value::NUMBER});
        scratch = makeNumberCheck(loc, std::hypot(args[0].v.d, args[1].v.d));
        return nullptr;
    }